

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::sanitize_append_path_element(aux *this,string *path,string_view element)

{
  pair<int,_int> pVar1;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  ulong uVar8;
  char *extraout_RDX_03;
  char *pcVar9;
  char cVar10;
  string *psVar11;
  long lVar12;
  bool bVar13;
  string_view str;
  uint local_74;
  char *local_70;
  int local_64;
  string *local_60;
  undefined8 local_58;
  int local_4c;
  char *local_48;
  long local_40;
  long local_38;
  
  pcVar7 = (char *)element._M_len;
  if ((path != (string *)0x1) || (*pcVar7 != '.')) {
    ::std::__cxx11::string::reserve((ulong)this);
    cVar10 = (char)this;
    if (*(long *)(this + 8) == 0) {
      local_40 = 0;
      pcVar9 = extraout_RDX;
    }
    else {
      ::std::__cxx11::string::push_back(cVar10);
      local_40 = -1;
      pcVar9 = extraout_RDX_00;
    }
    if (path == (string *)0x0) {
      ::std::__cxx11::string::append((char *)this);
      return;
    }
    local_4c = (int)path + -10;
    local_38 = (long)(int)path + -1;
    local_70 = (char *)0x0;
    psVar11 = (string *)0x0;
    local_74 = 0;
    local_58 = 0;
    local_60 = path;
    local_48 = pcVar7;
    do {
      str._M_str = pcVar9;
      str._M_len = (size_t)(pcVar7 + (long)psVar11);
      pVar1 = parse_utf8_codepoint((aux *)((long)path - (long)psVar11),str);
      iVar6 = pVar1.first;
      lVar4 = (long)pVar1 >> 0x20;
      if (iVar6 < 0) {
LAB_0037095a:
        if ((iVar6 < 0x20) || (iVar6 < 0x80 && (char)pVar1.first == '\0')) {
          ::std::__cxx11::string::push_back(cVar10);
          local_70 = (char *)(ulong)((int)local_70 + 1);
          bVar13 = false;
          pcVar9 = extraout_RDX_03;
        }
        else {
          if (psVar11 < (string *)((long)&(psVar11->_M_dataplus)._M_p + lVar4)) {
            lVar12 = 0;
            do {
              ::std::__cxx11::string::push_back(cVar10);
              lVar12 = lVar12 + 1;
            } while (lVar4 != lVar12);
          }
          local_58 = CONCAT71((int7)((ulong)local_58 >> 8),(char)local_58 + (iVar6 == 0x2e));
          uVar5 = (int)local_70 + pVar1.second;
          local_70 = (char *)(ulong)uVar5;
          bVar13 = false;
          pcVar9 = local_70;
          path = local_60;
          pcVar7 = local_48;
          if ((0xef < (int)uVar5) && (bVar13 = false, local_74 == 0)) {
            iVar6 = (int)psVar11;
            if ((int)psVar11 < local_4c) {
              iVar6 = local_4c;
            }
            uVar8 = (ulong)local_60 & 0xffffffff;
            lVar12 = local_38;
            do {
              if (lVar12 <= iVar6) {
                uVar5 = 0xffffffff;
                break;
              }
              uVar5 = (int)uVar8 - 1;
              uVar8 = (ulong)uVar5;
              pcVar9 = local_48 + lVar12;
              lVar12 = lVar12 + -1;
            } while (*pcVar9 != '.');
            bVar13 = uVar5 == 0xffffffff;
            if (!bVar13) {
              local_74 = 1;
            }
            pcVar9 = (char *)(ulong)local_74;
            if (!bVar13) {
              psVar11 = (string *)(long)(int)(uVar5 - pVar1.second);
            }
          }
        }
      }
      else {
        local_64 = iVar6;
        piVar2 = ::std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (libtorrent::(anonymous_namespace)::filter_path_character(int)::bad_cp,
                            &libtorrent::(anonymous_namespace)::filter_path_character(int)::
                             invalid_chars,&local_64);
        path = local_60;
        if (piVar2 == (int *)&libtorrent::(anonymous_namespace)::filter_path_character(int)::
                              invalid_chars) {
          if (local_64 < 0x80) {
            pvVar3 = memchr(&libtorrent::(anonymous_namespace)::filter_path_character(int)::
                             invalid_chars,(int)(char)local_64,3);
            bVar13 = false;
            pcVar9 = extraout_RDX_02;
            path = local_60;
            if (pvVar3 != (void *)0x0) goto LAB_00370a30;
          }
          goto LAB_0037095a;
        }
        pcVar9 = extraout_RDX_01;
        bVar13 = false;
      }
LAB_00370a30:
    } while ((!bVar13) &&
            (psVar11 = (string *)((long)&(psVar11->_M_dataplus)._M_p + lVar4), psVar11 < path));
    iVar6 = (int)local_70;
    if (iVar6 < 3 && iVar6 == (char)local_58) {
      lVar4 = (*(long *)(this + 8) + *(long *)this) - (long)iVar6;
      *(long *)(this + 8) = (lVar4 + local_40) - *(long *)this;
      *(undefined1 *)(lVar4 + local_40) = 0;
    }
    else if (*(long *)(this + 8) == 0) {
      ::std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x4061ae);
    }
  }
  return;
}

Assistant:

void sanitize_append_path_element(std::string& path, string_view element)
	{
		if (element.size() == 1 && element[0] == '.') return;

#ifdef TORRENT_WINDOWS
#define TORRENT_SEPARATOR '\\'
#else
#define TORRENT_SEPARATOR '/'
#endif
		path.reserve(path.size() + element.size() + 2);
		int added_separator = 0;
		if (!path.empty())
		{
			path += TORRENT_SEPARATOR;
			added_separator = 1;
		}

		if (element.empty())
		{
			path += "_";
			return;
		}

#if !TORRENT_USE_UNC_PATHS && defined TORRENT_WINDOWS
#pragma message ("building for windows without UNC paths is deprecated")

		// if we're not using UNC paths on windows, there
		// are certain filenames we're not allowed to use
		static const char const* reserved_names[] =
		{
			"con", "prn", "aux", "clock$", "nul",
			"com0", "com1", "com2", "com3", "com4",
			"com5", "com6", "com7", "com8", "com9",
			"lpt0", "lpt1", "lpt2", "lpt3", "lpt4",
			"lpt5", "lpt6", "lpt7", "lpt8", "lpt9"
		};
		int num_names = sizeof(reserved_names)/sizeof(reserved_names[0]);

		// this is not very efficient, but it only affects some specific
		// windows builds for now anyway (not even the default windows build)
		std::string pe(element);
		char const* file_end = strrchr(pe.c_str(), '.');
		std::string name = file_end
			? std::string(pe.data(), file_end)
			: pe;
		std::transform(name.begin(), name.end(), name.begin(), &to_lower);
		char const** str = std::find(reserved_names, reserved_names + num_names, name);
		if (str != reserved_names + num_names)
		{
			pe = "_" + pe;
			element = string_view();
		}
#endif
#ifdef TORRENT_WINDOWS
		// this counts the number of unicode characters
		// we've added (which is different from the number
		// of bytes)
		int unicode_chars = 0;
#endif

		int added = 0;
		// the number of dots we've added
		char num_dots = 0;
		bool found_extension = false;

		int seq_len = 0;
		for (std::size_t i = 0; i < element.size(); i += std::size_t(seq_len))
		{
			std::int32_t code_point;
			std::tie(code_point, seq_len) = parse_utf8_codepoint(element.substr(i));

			if (code_point >= 0 && filter_path_character(code_point))
			{
				continue;
			}

			if (code_point < 0 || !valid_path_character(code_point))
			{
				// invalid utf8 sequence, replace with "_"
				path += '_';
				++added;
#ifdef TORRENT_WINDOWS
				++unicode_chars;
#endif
				continue;
			}

			// validation passed, add it to the output string
			for (std::size_t k = i; k < i + std::size_t(seq_len); ++k)
			{
				TORRENT_ASSERT(element[k] != 0);
				path.push_back(element[k]);
			}

			if (code_point == '.') ++num_dots;

			added += seq_len;
#ifdef TORRENT_WINDOWS
			++unicode_chars;
#endif

			// any given path element should not
			// be more than 255 characters
			// if we exceed 240, pick up any potential
			// file extension and add that too
#ifdef TORRENT_WINDOWS
			if (unicode_chars >= 240 && !found_extension)
#else
			if (added >= 240 && !found_extension)
#endif
			{
				int dot = -1;
				for (int j = int(element.size()) - 1;
					j > std::max(int(element.size()) - 10, int(i)); --j)
				{
					if (element[aux::numeric_cast<std::size_t>(j)] != '.') continue;
					dot = j;
					break;
				}
				// there is no extension
				if (dot == -1) break;
				found_extension = true;
				TORRENT_ASSERT(dot > 0);
				i = std::size_t(dot - seq_len);
			}
		}

		if (added == num_dots && added <= 2)
		{
			// revert everything
			path.erase(path.end() - added - added_separator, path.end());
			return;
		}

#ifdef TORRENT_WINDOWS
		// remove trailing spaces and dots. These aren't allowed in filenames on windows
		for (int i = int(path.size()) - 1; i >= 0; --i)
		{
			if (path[i] != ' ' && path[i] != '.') break;
			path.resize(i);
			--added;
			TORRENT_ASSERT(added >= 0);
		}

		if (added == 0 && added_separator)
		{
			// remove the separator added at the beginning
			path.erase(path.end() - 1);
			return;
		}
#endif

		if (path.empty()) path = "_";
	}